

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O3

Vec_Ptr_t *
Aig_ManPartSplit(Aig_Man_t *p,Vec_Int_t *vNode2Part,Vec_Ptr_t **pvPio2Id,Vec_Ptr_t **pvPart2Pos)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Vec_t *pVVar6;
  Aig_Man_t *pAVar7;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  Vec_Int_t *vPio2IdOne;
  ulong local_70;
  Vec_Int_t *local_38;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar5->pArray = ppvVar4;
  uVar12 = vNode2Part->nSize;
  uVar15 = (ulong)uVar12;
  if (uVar15 == 0) {
    pVVar6 = (Vec_Vec_t *)malloc(0x10);
    uVar2 = 8;
  }
  else {
    uVar16 = *vNode2Part->pArray;
    if (1 < (int)uVar12) {
      uVar10 = 1;
      do {
        uVar2 = vNode2Part->pArray[uVar10];
        if ((int)uVar16 <= (int)uVar2) {
          uVar16 = uVar2;
        }
        uVar10 = uVar10 + 1;
      } while (uVar15 != uVar10);
    }
    if ((int)uVar16 < 0) {
      __assert_fail("nParts > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                    ,0xed,
                    "Vec_Ptr_t *Aig_ManPartSplit(Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t **, Vec_Ptr_t **)"
                   );
    }
    pVVar6 = (Vec_Vec_t *)malloc(0x10);
    uVar2 = 8;
    if (6 < uVar16) {
      uVar2 = uVar16 + 1;
    }
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar2;
  ppvVar4 = (void **)malloc((ulong)uVar2 << 3);
  pVVar6->pArray = ppvVar4;
  if (0 < (int)uVar12) {
    lVar17 = 0;
    do {
      pVVar9 = p->vObjs;
      if (pVVar9 == (Vec_Ptr_t *)0x0) {
        pvVar8 = (void *)0x0;
      }
      else {
        if (pVVar9->nSize <= lVar17) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar8 = pVVar9->pArray[lVar17];
      }
      if (0xfffffffd < (*(uint *)((long)pvVar8 + 0x18) & 7) - 7) {
        Vec_VecPush(pVVar6,vNode2Part->pArray[lVar17],pvVar8);
        uVar15 = (ulong)(uint)vNode2Part->nSize;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (int)uVar15);
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar17 = 0;
    do {
      uVar15 = *(ulong *)((long)pVVar9->pArray[lVar17] + 8);
      uVar11 = uVar15 & 0xfffffffffffffffe;
      uVar10 = *(ulong *)(uVar11 + 0x18);
      if (((uint)uVar10 & 7) == 2) {
        *(ulong *)(uVar11 + 0x18) = uVar10 | (ulong)((uVar15 & 1) == 0) * 0x10 + 0x10;
      }
      lVar17 = lVar17 + 1;
      pVVar9 = p->vCos;
    } while (lVar17 < pVVar9->nSize);
  }
  if (pVVar6->nSize < 1) {
    uVar12 = 0;
  }
  else {
    local_70 = 100;
    uVar12 = 0;
    uVar15 = 100;
    iVar13 = 0;
    uVar10 = 0;
    do {
      if (((Vec_Ptr_t *)pVVar6->pArray[uVar10])->nSize == 0) {
        printf("Aig_ManPartSplit(): Skipping partition # %d without nodes (warning).\n",
               uVar10 & 0xffffffff);
      }
      else {
        pAVar7 = Aig_ManPartSplitOne(p,(Vec_Ptr_t *)pVVar6->pArray[uVar10],&local_38);
        pVVar1 = local_38;
        iVar14 = (int)uVar15;
        if (iVar13 == iVar14) {
          if (iVar14 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar4;
            pVVar5->nCap = 0x10;
            uVar15 = 0x10;
          }
          else {
            uVar15 = (ulong)(uint)(iVar14 * 2);
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(uVar15 * 8);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar5->pArray,uVar15 * 8);
            }
            pVVar5->pArray = ppvVar4;
            pVVar5->nCap = iVar14 * 2;
          }
        }
        else {
          ppvVar4 = pVVar5->pArray;
        }
        pVVar5->nSize = iVar13 + 1;
        ppvVar4[iVar13] = pVVar1;
        uVar2 = (uint)local_70;
        if (uVar12 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = 0x10;
            local_70 = 0x10;
          }
          else {
            local_70 = (ulong)(uVar2 * 2);
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(local_70 * 8);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,local_70 * 8);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar4 = pVVar3->pArray;
        }
        lVar17 = (long)(int)uVar12;
        uVar12 = uVar12 + 1;
        pVVar3->nSize = uVar12;
        ppvVar4[lVar17] = pAVar7;
        iVar13 = iVar13 + 1;
      }
      uVar10 = uVar10 + 1;
      iVar14 = pVVar6->nSize;
    } while ((long)uVar10 < (long)iVar14);
    if (0 < iVar14) {
      lVar17 = 0;
      do {
        pvVar8 = pVVar6->pArray[lVar17];
        if (pvVar8 != (void *)0x0) {
          if (*(void **)((long)pvVar8 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar8 + 8));
          }
          free(pvVar8);
        }
        lVar17 = lVar17 + 1;
      } while (iVar14 != lVar17);
    }
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
  }
  free(pVVar6);
  pVVar6 = (Vec_Vec_t *)malloc(0x10);
  uVar2 = 8;
  if (6 < uVar12 - 1) {
    uVar2 = uVar12;
  }
  pVVar6->nCap = uVar2;
  if (uVar2 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)(int)uVar2 << 3);
  }
  pVVar6->pArray = ppvVar4;
  if (0 < (int)uVar12) {
    uVar15 = 0;
    do {
      pvVar8 = calloc(1,0x10);
      ppvVar4[uVar15] = pvVar8;
      uVar15 = uVar15 + 1;
    } while (uVar12 != uVar15);
  }
  pVVar6->nSize = uVar12;
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar17 = 0;
    do {
      uVar15 = *(ulong *)((long)pVVar9->pArray[lVar17] + 8);
      uVar10 = uVar15 & 0xfffffffffffffffe;
      if (((uint)*(ulong *)(uVar10 + 0x18) & 7) == 2) {
        *(ulong *)(uVar10 + 0x18) = *(ulong *)(uVar10 + 0x18) & 0xffffffffffffffca;
      }
      else {
        if (uVar15 == 0) {
LAB_0063f907:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar13 = *(int *)(uVar10 + 0x24);
        if (((long)iVar13 < 0) || (vNode2Part->nSize <= iVar13)) goto LAB_0063f907;
        Vec_VecPush(pVVar6,vNode2Part->pArray[iVar13],pVVar9->pArray[lVar17]);
      }
      lVar17 = lVar17 + 1;
      pVVar9 = p->vCos;
    } while (lVar17 < pVVar9->nSize);
  }
  *pvPio2Id = pVVar5;
  *pvPart2Pos = (Vec_Ptr_t *)pVVar6;
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Aig_ManPartSplit( Aig_Man_t * p, Vec_Int_t * vNode2Part, Vec_Ptr_t ** pvPio2Id, Vec_Ptr_t ** pvPart2Pos )
{
    Vec_Vec_t * vGroups, * vPart2Pos;
    Vec_Ptr_t * vAigs, * vPio2Id, * vNodes;
    Vec_Int_t * vPio2IdOne;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObj, * pDriver;
    int i, nodePart, nParts;
    vAigs = Vec_PtrAlloc( 100 );
    vPio2Id = Vec_PtrAlloc( 100 );
    // put all nodes into levels according to their partition
    nParts = Vec_IntFindMax(vNode2Part) + 1;
    assert( nParts > 0 );
    vGroups = Vec_VecAlloc( nParts );
    Vec_IntForEachEntry( vNode2Part, nodePart, i )
    {
        pObj = Aig_ManObj( p, i );
        if ( Aig_ObjIsNode(pObj) )
            Vec_VecPush( vGroups, nodePart, pObj );
    }

    // label PIs that should be restricted to some values
    Aig_ManForEachCo( p, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsCi(pDriver) )
        {
            if ( Aig_ObjFaninC0(pObj) )
                pDriver->fMarkA = 1; // const0 PI
            else
                pDriver->fMarkB = 1; // const1 PI
        }
    }

    // create partitions
    Vec_VecForEachLevel( vGroups, vNodes, i )
    {
        if ( Vec_PtrSize(vNodes) == 0 )
        {
            printf( "Aig_ManPartSplit(): Skipping partition # %d without nodes (warning).\n", i );
            continue;
        }
        pAig = Aig_ManPartSplitOne( p, vNodes, &vPio2IdOne );
        Vec_PtrPush( vPio2Id, vPio2IdOne );
        Vec_PtrPush( vAigs, pAig );
    }
    Vec_VecFree( vGroups );

    // divide POs according to their partitions
    vPart2Pos = Vec_VecStart( Vec_PtrSize(vAigs) );
    Aig_ManForEachCo( p, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsCi(pDriver) )
            pDriver->fMarkA = pDriver->fMarkB = 0;
        else
            Vec_VecPush( vPart2Pos, Vec_IntEntry(vNode2Part, Aig_ObjFaninId0(pObj)), pObj );
    }

    *pvPio2Id = vPio2Id;
    *pvPart2Pos = (Vec_Ptr_t *)vPart2Pos;
    return vAigs;
}